

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

bool __thiscall nivalis::Shell::eval_line(Shell *this,string *line)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte opchar;
  uint32_t opcode;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  pointer pAVar8;
  uint64_t uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  size_t i_1;
  char *pcVar10;
  string *psVar11;
  _Alloc_hider s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  undefined1 in_R8B;
  size_t i;
  long lVar12;
  size_t i_2;
  long lVar13;
  string_view expr_00;
  string_view expr_01;
  string_view expr_02;
  string_view expr_03;
  double local_160;
  string parse_err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  def_fn_args;
  string var;
  Expr diff;
  string str_to_parse;
  string cmd;
  uint64_t local_80;
  Expr expr;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_60;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_48;
  
  str_to_parse._M_dataplus._M_p = (pointer)&str_to_parse.field_2;
  str_to_parse._M_string_length = 0;
  var._M_dataplus._M_p = (pointer)&var.field_2;
  var._M_string_length = 0;
  str_to_parse.field_2._M_local_buf[0] = '\0';
  var.field_2._M_local_buf[0] = '\0';
  def_fn_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  def_fn_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  def_fn_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util::trim((util *)line,line);
  std::__cxx11::string::_M_assign((string *)&str_to_parse);
  pcVar10 = "exit";
  bVar1 = std::operator==(line,"exit");
  if (bVar1) {
    this->closed = true;
    bVar1 = true;
    goto LAB_00122603;
  }
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  cmd._M_string_length = 0;
  cmd.field_2._M_local_buf[0] = '\0';
  if ((line->_M_string_length != 0) && (*(line->_M_dataplus)._M_p == '%')) {
    anon_unknown.dwarf_3ad60::get_word(&parse_err,line);
    pcVar10 = (char *)&parse_err;
    std::__cxx11::string::operator=((string *)&cmd,(string *)&parse_err);
    std::__cxx11::string::~string((string *)&parse_err);
  }
  util::trim((util *)line,(string *)pcVar10);
  util::trim((util *)&cmd,(string *)pcVar10);
  bVar1 = std::operator==(&cmd,"%del");
  if (bVar1) {
    bVar1 = Environment::del(this->env,line);
    poVar5 = this->os;
    if (bVar1) {
      pcVar10 = "del ";
LAB_00122053:
      poVar5 = std::operator<<(poVar5,pcVar10);
      poVar5 = std::operator<<(poVar5,(string *)line);
      bVar1 = true;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      pcVar10 = "Undefined variable ";
LAB_00122106:
      poVar5 = std::operator<<(poVar5,pcVar10);
      poVar5 = std::operator<<(poVar5,(string *)line);
      std::operator<<(poVar5,"\n");
LAB_001225f4:
      bVar1 = false;
    }
  }
  else {
    bVar1 = std::operator==(&cmd,"%delf");
    if (bVar1) {
      bVar1 = Environment::del_func(this->env,line);
      poVar5 = this->os;
      if (!bVar1) {
        pcVar10 = "Undefined function ";
        goto LAB_00122106;
      }
      pcVar10 = "delf ";
      goto LAB_00122053;
    }
    bVar2 = std::operator==(&cmd,"%");
    bVar1 = true;
    if ((!bVar2) && (bVar2 = std::operator==(&cmd,"%tex"), !bVar2)) {
      bVar1 = std::operator==(&cmd,"%niv");
    }
    if ((this->use_latex != false) || (bVar2 = std::operator==(&cmd,"%tex"), bVar2)) {
      bVar2 = std::operator!=(&cmd,"%niv");
    }
    else {
      bVar2 = false;
    }
    bVar3 = std::operator==(&cmd,"%diff");
    if (bVar1 != false) {
      std::__cxx11::string::_M_assign((string *)&str_to_parse);
    }
    if (bVar3) {
      psVar11 = line;
      anon_unknown.dwarf_3ad60::get_word(&parse_err,line);
      util::trim((util *)&parse_err,psVar11);
      util::trim((util *)line,psVar11);
      expr_00._M_str = extraout_RDX;
      expr_00._M_len = (size_t)parse_err._M_dataplus._M_p;
      bVar4 = util::is_varname((util *)parse_err._M_string_length,expr_00);
      if (bVar4) {
        local_80 = Environment::addr_of(this->env,&parse_err,false);
        std::__cxx11::string::_M_assign((string *)&str_to_parse);
      }
      else {
        poVar5 = std::operator<<(this->os,(string *)&parse_err);
        std::operator<<(poVar5," is not a valid variable name\n");
      }
      std::__cxx11::string::~string((string *)&parse_err);
      if (!bVar4) goto LAB_001225f4;
    }
    bVar4 = util::is_varname_first(*str_to_parse._M_dataplus._M_p);
    opcode = 0x18;
    if ((bVar4) &&
       (expr_01._M_str = (char *)0x0, expr_01._M_len = (size_t)str_to_parse._M_dataplus._M_p,
       sVar6 = util::find_equality((util *)str_to_parse._M_string_length,expr_01,true,(bool)in_R8B),
       sVar6 != 0xffffffffffffffff)) {
      std::__cxx11::string::substr((ulong)&parse_err,(ulong)&str_to_parse);
      psVar11 = &parse_err;
      std::__cxx11::string::operator=((string *)&var,(string *)&parse_err);
      std::__cxx11::string::~string((string *)&parse_err);
      util::trim((util *)&var,psVar11);
      opchar = var._M_dataplus._M_p[var._M_string_length - 1];
      opcode = 0x18;
      pcVar10 = extraout_RDX_00;
      if ((opchar - 0x25 < 0x3a) &&
         (pcVar10 = (char *)0x200000000000561,
         (0x200000000000561U >> ((ulong)(opchar - 0x25) & 0x3f) & 1) != 0)) {
        s = var._M_dataplus;
        opcode = OpCode::from_char(opchar);
        std::__cxx11::string::pop_back();
        util::trim((util *)&var,(string *)s._M_p);
        opchar = var._M_dataplus._M_p[var._M_string_length - 1];
        pcVar10 = extraout_RDX_01;
      }
      if (opchar != 0x29) {
        expr_03._M_str = pcVar10;
        expr_03._M_len = (size_t)var._M_dataplus._M_p;
        bVar4 = util::is_varname((util *)var._M_string_length,expr_03);
        if (bVar4) {
          std::__cxx11::string::substr((ulong)&parse_err,(ulong)&str_to_parse);
          std::__cxx11::string::operator=((string *)&str_to_parse,(string *)&parse_err);
          std::__cxx11::string::~string((string *)&parse_err);
        }
        goto LAB_001224e6;
      }
      bVar4 = false;
      uVar7 = std::__cxx11::string::find((char)&var,0x28);
      if (uVar7 != 0xffffffffffffffff) {
        do {
          lVar12 = uVar7 + 1;
          lVar13 = 0;
          while( true ) {
            uVar7 = lVar12 + lVar13;
            bVar4 = true;
            if (var._M_string_length <= uVar7) goto LAB_00122418;
            if ((var._M_dataplus._M_p[lVar13 + lVar12] == ')') ||
               (var._M_dataplus._M_p[lVar13 + lVar12] == ',')) break;
            lVar13 = lVar13 + 1;
          }
          std::__cxx11::string::substr((ulong)&parse_err,(ulong)&var);
          s_00 = &parse_err;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &def_fn_args,&parse_err);
          std::__cxx11::string::~string((string *)&parse_err);
          util::trim((util *)(def_fn_args.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1),s_00);
          if ((var._M_dataplus._M_p[lVar13 + lVar12] == ')') &&
             (((long)def_fn_args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)def_fn_args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20 &&
              (def_fn_args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length == 0)))) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&def_fn_args);
            goto LAB_00122418;
          }
        } while (((util *)def_fn_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length !=
                  (util *)0x0) &&
                ((pcVar10 = def_fn_args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,
                 *pcVar10 == '$' ||
                 (expr_02._M_str = extraout_RDX_02, expr_02._M_len = (size_t)pcVar10,
                 bVar4 = util::is_varname((util *)def_fn_args.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  _M_string_length,expr_02), bVar4))));
        poVar5 = std::operator<<(this->os,"\'");
        poVar5 = std::operator<<(poVar5,(string *)
                                        (def_fn_args.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -1));
        std::operator<<(poVar5,"\': invalid argument variable name\n");
        bVar4 = false;
LAB_00122418:
        std::__cxx11::string::substr((ulong)&parse_err,(ulong)&var);
        psVar11 = &parse_err;
        std::__cxx11::string::operator=((string *)&var,(string *)&parse_err);
        std::__cxx11::string::~string((string *)&parse_err);
        util::rtrim((util *)&var,psVar11);
        if (!bVar4) goto LAB_001224e6;
        std::__cxx11::string::substr((ulong)&parse_err,(ulong)&str_to_parse);
        std::__cxx11::string::operator=((string *)&str_to_parse,(string *)&parse_err);
        std::__cxx11::string::~string((string *)&parse_err);
        bVar4 = true;
      }
    }
    else {
LAB_001224e6:
      bVar4 = false;
    }
    lVar12 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)def_fn_args.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)def_fn_args.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      Environment::addr_of
                (this->env,
                 (string *)
                 ((long)&((def_fn_args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12),
                 false);
      lVar12 = lVar12 + 0x20;
    }
    parse_err._M_dataplus._M_p = (pointer)&parse_err.field_2;
    parse_err._M_string_length = 0;
    parse_err.field_2._M_local_buf[0] = '\0';
    if (bVar2 == false) {
      std::__cxx11::string::string((string *)&diff,(string *)&str_to_parse);
    }
    else {
      latex_to_nivalis((string *)&diff,&str_to_parse);
    }
    parse(&expr,(string *)&diff,this->env,(bool)((bVar1 | bVar3) ^ 1),true,
          (long)def_fn_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)def_fn_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5,&parse_err);
    std::__cxx11::string::~string((string *)&diff);
    if (parse_err._M_string_length != 0) {
      std::operator<<(this->os,(string *)&parse_err);
LAB_001225dd:
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&expr);
      std::__cxx11::string::~string((string *)&parse_err);
      goto LAB_001225f4;
    }
    if (bVar1 == false) {
      if (bVar3) {
        Expr::diff(&diff,&expr,local_80,this->env);
        poVar5 = Expr::repr(&diff,this->os,this->env);
        std::operator<<(poVar5,"\n");
        std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       *)&diff);
      }
      else if (bVar4) {
        diff.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        diff.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        diff.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar12 = 0;
        for (uVar7 = 0;
            uVar7 < (ulong)((long)def_fn_args.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)def_fn_args.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1
            ) {
          pAVar8 = (pointer)0xffffffffffffffff;
          if (**(char **)((long)&((def_fn_args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar12) != '$') {
            pAVar8 = (pointer)Environment::addr_of
                                        (this->env,
                                         (string *)
                                         ((long)&((def_fn_args.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar12),true);
          }
          local_60._M_impl.super__Vector_impl_data._M_start = pAVar8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&diff,
                     (unsigned_long *)&local_60);
          lVar12 = lVar12 + 0x20;
        }
        uVar9 = Environment::def_func
                          (this->env,&var,&expr,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&diff);
        if (uVar9 != 0xffffffffffffffff) {
          poVar5 = std::operator<<(this->os,(string *)&var);
          std::operator<<(poVar5,"(");
          for (uVar7 = 0;
              uVar7 < (ulong)((long)def_fn_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)def_fn_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar7 = uVar7 + 1) {
            if (uVar7 != 0) {
              std::operator<<(this->os,", ");
            }
            poVar5 = std::operator<<(this->os,"$");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          }
          std::operator<<(this->os,") = ");
          poVar5 = Expr::repr(&(this->env->funcs).
                               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9].expr,this->os,
                              this->env);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&diff);
      }
      else {
        local_160 = Expr::operator()(&expr,this->env);
        if (!NAN(local_160)) {
          if ((var._M_string_length == 0) || (parse_err._M_string_length != 0)) {
            poVar5 = std::ostream::_M_insert<double>(local_160);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          else {
            if (opcode != 0x18) {
              uVar9 = Environment::addr_of(this->env,&var,true);
              if (uVar9 == 0xffffffffffffffff) {
                poVar5 = std::operator<<(this->os,"Undefined variable \"");
                poVar5 = std::operator<<(poVar5,(string *)&var);
                std::operator<<(poVar5,"\" (operator assignment)\n");
                goto LAB_001225dd;
              }
              Expr::constant((Expr *)&local_60,
                             (this->env->vars).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9]);
              Expr::constant((Expr *)&local_48,local_160);
              Expr::combine(&diff,(Expr *)&local_60,opcode,(Expr *)&local_48);
              local_160 = Expr::operator()(&diff,this->env);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)&diff);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base(&local_48);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base(&local_60);
            }
            Environment::set(this->env,&var,local_160);
            poVar5 = std::operator<<(this->os,(string *)&var);
            std::operator<<(poVar5," = ");
            poVar5 = std::ostream::_M_insert<double>(local_160);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
        }
      }
    }
    else {
      Expr::optimize(&expr,5);
      poVar5 = Expr::repr(&expr,this->os,this->env);
      std::operator<<(poVar5,"\n");
    }
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &expr);
    std::__cxx11::string::~string((string *)&parse_err);
    bVar1 = true;
  }
  std::__cxx11::string::~string((string *)&cmd);
LAB_00122603:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&def_fn_args);
  std::__cxx11::string::~string((string *)&var);
  std::__cxx11::string::~string((string *)&str_to_parse);
  return bVar1;
}

Assistant:

bool Shell::eval_line(std::string line) {
    int assn_opcode = OpCode::bsel;
    std::string str_to_parse, var;
    std::vector<std::string> def_fn_args;
    bool def_fn;
    util::trim(line);
    str_to_parse = line;
    if (line == "exit") {
        // Exit shell, if applicable
        closed = true;
        return true;
    }

    std::string cmd;
    if (line.size() && line[0] == '%') {
        cmd = get_word(line);
    }
    util::trim(line);
    util::trim(cmd);
    if (cmd == "%del") {
        // Delete variable
        if (env.del(line)) {
            os << "del " << line << std::endl;
        } else {
            os << "Undefined variable " << line << "\n";
            return false;
        }
    } else if (cmd == "%delf") {
        // Delete function
        if (env.del_func(line)) {
            os << "delf " << line << std::endl;
        } else {
            os << "Undefined function " << line << "\n";
            return false;
        }
    } else {
        bool do_optim = cmd == "%" || cmd == "%tex" || cmd == "%niv";
        bool will_use_latex = (use_latex || cmd == "%tex") && cmd != "%niv";
        bool do_diff = cmd == "%diff";
        if (do_optim) str_to_parse = line;
        uint64_t diff_var_addr;
        if (do_diff) {
            std::string diff_var = get_word(line);
            util::trim(diff_var); util::trim(line);
            if (!util::is_varname(diff_var)) {
                os << diff_var << " is not a valid variable name\n";
                return false;
            }
            diff_var_addr = env.addr_of(diff_var, false);
            str_to_parse = line;
        }
        // Evaluate
        def_fn = false;
        assn_opcode = OpCode::bsel;
        if (util::is_varname_first(str_to_parse[0])) {
            size_t pos = util::find_equality(str_to_parse);
            if (~pos) {
                var = str_to_parse.substr(0, pos);
                util::trim(var);
                if (util::is_arith_operator(var.back())) {
                    assn_opcode = OpCode::from_char(var.back());
                    var.pop_back();
                    util::trim(var);
                }
                if (var.back() == ')') {
                    auto brpos = var.find('(');
                    if (brpos != std::string::npos) {
                        // Function def
                        def_fn = true;
                        size_t prev_comma = brpos + 1;
                        for (size_t i = brpos + 1; i < var.size(); ++i) {
                            if (var[i] == ',' || var[i] == ')') {
                                def_fn_args.push_back(var.substr(
                                            prev_comma, i - prev_comma));
                                util::trim(def_fn_args.back());
                                if (var[i] == ')' && def_fn_args.size() == 1 &&
                                    def_fn_args.back().empty()) {
                                    // Function with no arguments
                                    def_fn_args.clear();
                                    break;
                                }
                                if (def_fn_args.back().empty() ||
                                    (def_fn_args.back()[0] != '$' &&
                                    !util::is_varname(def_fn_args.back()))) {
                                    os << "'" << def_fn_args.back() <<
                                        "': invalid argument variable name\n";
                                    def_fn = false;
                                    break;
                                }
                                prev_comma = i + 1;
                            }
                        }
                        var = var.substr(0, brpos);
                        util::rtrim(var);
                        if (def_fn) str_to_parse = str_to_parse.substr(pos + 1);
                    }
                } else if (util::is_varname(var)) {
                    // Assignment
                    str_to_parse = str_to_parse.substr(pos + 1);
                }
            }
        }

        for (size_t i = 0; i < def_fn_args.size(); ++i) {
            // Pre-register variables
            env.addr_of(def_fn_args[i], false);
        }
        std::string parse_err;
        Expr expr = parse(will_use_latex ?  latex_to_nivalis(str_to_parse)
                : str_to_parse, env, !(do_diff || do_optim), // expicit
                true, // quiet
                def_fn_args.size(), // max args
                &parse_err);
        if (parse_err.size()) {
            os << parse_err;
            return false;
        }
        if (do_optim) {
            expr.optimize();
            expr.repr(os, env) << "\n";
        } else if (do_diff) {
            Expr diff = expr.diff(diff_var_addr, env);
            diff.repr(os, env) << "\n";
        } else {
            double output;
            if (def_fn || !std::isnan(output = expr(env))) {
                // Assignment statement
                if (var.size() && parse_err.empty()) {
                    if (def_fn) {
                        // Define function
                        std::vector<uint64_t> bindings;
                        for (size_t i = 0; i < def_fn_args.size(); ++i) {
                            bindings.push_back(
                                    def_fn_args[i][0] == '$' ? -1 :
                                    env.addr_of(def_fn_args[i]));
                        }
                        auto addr = env.def_func(var, expr, bindings);
                        if (~addr) {
                            os << var << "(";
                            for (size_t i = 0; i < def_fn_args.size(); ++i) {
                                if (i) os << ", ";
                                os << "$" << i;
                            }
                            os << ") = ";
                            env.funcs[addr].expr.repr(os, env) << std::endl;
                        }

                    } else {
                        // Define variable
                        double var_val;
                        if (assn_opcode != OpCode::bsel) {
                            // Operator assignment
                            auto addr = env.addr_of(var, true);
                            if (addr == -1) {
                                os << "Undefined variable \"" << var
                                    << "\" (operator assignment)\n";
                                return false;
                            }
                            var_val = Expr::constant(env.vars[addr])
                                .combine(assn_opcode,
                                        Expr::constant(output))(env);
                        } else {
                            // Usual assignment
                            var_val = output;
                        }
                        env.set(var, var_val);
                        os << var << " = " << var_val << std::endl;
                    }
                } else {
                    os << output << std::endl;
                }
            }
        }
    }
    return true;
}